

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

PagesConfig * __thiscall QPDFJob::PagesConfig::range(PagesConfig *this,string *arg)

{
  element_type *peVar1;
  pointer pPVar2;
  allocator<char> local_39;
  string local_38;
  
  peVar1 = (this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pPVar2 = *(pointer *)
            ((long)&(peVar1->page_specs).
                    super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if ((peVar1->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>
      ._M_impl.super__Vector_impl_data._M_start == pPVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"in --range must follow a file name",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    pPVar2 = *(pointer *)
              ((long)&(((this->config->o->m).
                        super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      page_specs).
                      super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                      _M_impl.super__Vector_impl_data + 8);
  }
  if (pPVar2[-1].range._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"--range already specified for this file",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::_M_assign((string *)&pPVar2[-1].range);
  return this;
}

Assistant:

QPDFJob::PagesConfig*
QPDFJob::PagesConfig::range(std::string const& arg)
{
    if (config->o.m->page_specs.empty()) {
        QTC::TC("qpdf", "QPDFJob misplaced page range");
        usage("in --range must follow a file name");
    }
    auto& last = config->o.m->page_specs.back();
    if (!last.range.empty()) {
        QTC::TC("qpdf", "QPDFJob duplicated range");
        usage("--range already specified for this file");
    }
    last.range = arg;
    return this;
}